

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

void prsgini(prscxdef *ctx,prsndef *node,uint curfr)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  undefined2 uVar4;
  emtcxdef *peVar5;
  uint16_t tmp;
  
  if ((node->prsnv).prsnvn[2] != (prsndef *)0x0) {
    prsgini(ctx,(node->prsnv).prsnvn[2],curfr);
  }
  if (node->prsnnlf == 4) {
    dbgclin(ctx->prscxtok,ctx->prscxemt->emtcxobj,(uint)ctx->prscxemt->emtcxofs);
    uVar2 = ctx->prscxemt->emtcxofs;
    uVar3 = ((node->prsnv).prsnvn[3]->prsnv).prsnvt.tokofs;
    emtres(ctx->prscxemt,ctx->prscxpool[(ulong)uVar3 + 1] + 1);
    memcpy(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs,ctx->prscxpool + uVar3,
           (ulong)ctx->prscxpool[(ulong)uVar3 + 1] + 1);
    ctx->prscxemt->emtcxofs = (ushort)ctx->prscxpool[(ulong)uVar3 + 1] + ctx->prscxemt->emtcxofs + 1
    ;
    *(short *)(ctx->prscxemt->emtcxptr + (ulong)uVar2 + 2) = (short)curfr;
  }
  prsgexp(ctx,(node->prsnv).prsnvn[0]);
  emtres(ctx->prscxemt,1);
  peVar5 = ctx->prscxemt;
  uVar2 = peVar5->emtcxofs;
  peVar5->emtcxofs = uVar2 + 1;
  peVar5->emtcxptr[uVar2] = 0xc0;
  uVar4 = *(undefined2 *)((long)&(node->prsnv).prsnvn[1]->prsnv + 8);
  emtres(ctx->prscxemt,2);
  *(undefined2 *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) = uVar4;
  puVar1 = &ctx->prscxemt->emtcxofs;
  *puVar1 = *puVar1 + 2;
  return;
}

Assistant:

void prsgini(prscxdef *ctx, prsndef *node, uint curfr)
{
    int lcl;
    
    /* descend tree - always generate in order specified by user */
    if (node->prsnv.prsnvn[2])
        prsgini(ctx, node->prsnv.prsnvn[2], curfr);
    
    /* generate OPCLINE if one was specified */
    if (node->prsnnlf == 4)
    {
        uchar *p;
        uint   oldofs;
        
        /* tell the line source about the OPCLINE instruction */
        dbgclin(ctx->prscxtok, ctx->prscxemt->emtcxobj,
                (uint)ctx->prscxemt->emtcxofs);
        
        /* now actually emit the OPCLINE instruction */
        oldofs = ctx->prscxemt->emtcxofs;
        p = ctx->prscxpool + node->prsnv.prsnvn[3]->prsnv.prsnvt.tokofs;
        emtmem(ctx->prscxemt, p, (uint)(*(p + 1) + 1));
        
        /* fix it up with the correct frame */
        emtint2at(ctx->prscxemt, curfr, oldofs + 2);
    }
    
    prsgexp(ctx, node->prsnv.prsnvn[0]);
    emtop(ctx->prscxemt, OPCSETLCL);
    lcl = node->prsnv.prsnvn[1]->prsnv.prsnvt.tokval;
    emtint2(ctx->prscxemt, lcl);
}